

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RtreeInit(sqlite3 *db)

{
  void *c_1;
  void *c;
  int rc;
  int utf8;
  sqlite3 *db_local;
  
  c._0_4_ = sqlite3_create_function
                      (db,"rtreenode",2,1,(void *)0x0,rtreenode,
                       (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                       (_func_void_sqlite3_context_ptr *)0x0);
  if ((int)c == 0) {
    c._0_4_ = sqlite3_create_function
                        (db,"rtreedepth",1,1,(void *)0x0,rtreedepth,
                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                         (_func_void_sqlite3_context_ptr *)0x0);
  }
  if ((int)c == 0) {
    c._0_4_ = sqlite3_create_function
                        (db,"rtreecheck",-1,1,(void *)0x0,rtreecheck,
                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                         (_func_void_sqlite3_context_ptr *)0x0);
  }
  if ((int)c == 0) {
    c._0_4_ = sqlite3_create_module_v2
                        (db,"rtree",&rtreeModule,(void *)0x0,(_func_void_void_ptr *)0x0);
  }
  if ((int)c == 0) {
    c._0_4_ = sqlite3_create_module_v2
                        (db,"rtree_i32",&rtreeModule,&DAT_00000001,(_func_void_void_ptr *)0x0);
  }
  return (int)c;
}

Assistant:

SQLITE_PRIVATE int sqlite3RtreeInit(sqlite3 *db){
  const int utf8 = SQLITE_UTF8;
  int rc;

  rc = sqlite3_create_function(db, "rtreenode", 2, utf8, 0, rtreenode, 0, 0);
  if( rc==SQLITE_OK ){
    rc = sqlite3_create_function(db, "rtreedepth", 1, utf8, 0,rtreedepth, 0, 0);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3_create_function(db, "rtreecheck", -1, utf8, 0,rtreecheck, 0,0);
  }
  if( rc==SQLITE_OK ){
#ifdef SQLITE_RTREE_INT_ONLY
    void *c = (void *)RTREE_COORD_INT32;
#else
    void *c = (void *)RTREE_COORD_REAL32;
#endif
    rc = sqlite3_create_module_v2(db, "rtree", &rtreeModule, c, 0);
  }
  if( rc==SQLITE_OK ){
    void *c = (void *)RTREE_COORD_INT32;
    rc = sqlite3_create_module_v2(db, "rtree_i32", &rtreeModule, c, 0);
  }
#ifdef SQLITE_ENABLE_GEOPOLY
  if( rc==SQLITE_OK ){
    rc = sqlite3_geopoly_init(db);
  }
#endif

  return rc;
}